

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_keeper.h
# Opt level: O2

void __thiscall
mp::
ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::LinearFunctionalConstraint>
::Container::Container(Container *this,int d,LinearFunctionalConstraint *c)

{
  LinearFunctionalConstraint local_c0;
  
  LinearFunctionalConstraint::LinearFunctionalConstraint(&local_c0,c);
  LinearFunctionalConstraint::LinearFunctionalConstraint
            ((LinearFunctionalConstraint *)this,&local_c0);
  LinearFunctionalConstraint::~LinearFunctionalConstraint(&local_c0);
  this->depth_ = d;
  (this->ctx_redef_).value_ = CTX_NONE;
  *(undefined4 *)((long)&(this->ctx_redef_).value_ + 3) = 0;
  return;
}

Assistant:

Container(int d, Constraint&& c) noexcept
      : con_(std::move(c)), depth_(d) { }